

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

void wallet::ApproximateBestSubset
               (FastRandomContext *insecure_rand,
               vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
               CAmount *nTotalLower,CAmount *nTargetValue,
               vector<char,_std::allocator<char>_> *vfBest,CAmount *nBest,int max_selection_weight,
               int iterations)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  pointer pOVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  value_type local_59;
  vector<char,_std::allocator<char>_> vfIncluded;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  vfIncluded.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vfIncluded.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vfIncluded.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_59 = '\x01';
  std::vector<char,_std::allocator<char>_>::_M_fill_assign
            (vfBest,((long)(groups->
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(groups->
                          super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x68,&local_59);
  *nBest = *nTotalLower;
  iVar5 = 0;
  do {
    if ((iVar5 == 1000) || (*nBest == *nTargetValue)) {
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&vfIncluded.super__Vector_base<char,_std::allocator<char>_>);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    local_59 = '\0';
    std::vector<char,_std::allocator<char>_>::_M_fill_assign
              (&vfIncluded,
               ((long)(groups->
                      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(groups->
                     super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                     _M_impl.super__Vector_impl_data._M_start) / 0x68,&local_59);
    lVar8 = 0;
    iVar6 = 0;
    bVar2 = false;
    uVar7 = 0;
    while ((uVar7 < 2 && (!bVar2))) {
      bVar2 = false;
      uVar9 = 0;
      while( true ) {
        uVar10 = (ulong)uVar9;
        pOVar4 = (groups->
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(groups->
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4) / 0x68) <=
            uVar10) break;
        if (uVar7 == 0) {
          bVar3 = RandomMixin<FastRandomContext>::randbool
                            (&insecure_rand->super_RandomMixin<FastRandomContext>);
          if (bVar3) {
            pOVar4 = (groups->
                     super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            goto LAB_00906892;
          }
        }
        else if (vfIncluded.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10] == '\0') {
LAB_00906892:
          lVar8 = lVar8 + *(long *)((long)&pOVar4[uVar10].m_value +
                                   (ulong)((pOVar4[uVar10].m_subtract_fee_outputs ^ 1) << 5));
          iVar6 = iVar6 + pOVar4[uVar10].m_weight;
          vfIncluded.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar10] = '\x01';
          if ((*nTargetValue <= lVar8) && (iVar6 <= max_selection_weight)) {
            if (lVar8 < *nBest) {
              *nBest = lVar8;
              std::vector<char,_std::allocator<char>_>::operator=(vfBest,&vfIncluded);
            }
            pOVar4 = (groups->
                     super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar8 = lVar8 - *(long *)((long)&pOVar4[uVar10].m_value +
                                     (ulong)((pOVar4[uVar10].m_subtract_fee_outputs ^ 1) << 5));
            iVar6 = iVar6 - pOVar4[uVar10].m_weight;
            vfIncluded.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] = '\0';
            bVar2 = true;
          }
        }
        uVar9 = uVar9 + 1;
      }
      uVar7 = uVar7 + 1;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static void ApproximateBestSubset(FastRandomContext& insecure_rand, const std::vector<OutputGroup>& groups,
                                  const CAmount& nTotalLower, const CAmount& nTargetValue,
                                  std::vector<char>& vfBest, CAmount& nBest, int max_selection_weight, int iterations = 1000)
{
    std::vector<char> vfIncluded;

    // Worst case "best" approximation is just all of the groups.
    vfBest.assign(groups.size(), true);
    nBest = nTotalLower;

    for (int nRep = 0; nRep < iterations && nBest != nTargetValue; nRep++)
    {
        vfIncluded.assign(groups.size(), false);
        CAmount nTotal = 0;
        int selected_coins_weight{0};
        bool fReachedTarget = false;
        for (int nPass = 0; nPass < 2 && !fReachedTarget; nPass++)
        {
            for (unsigned int i = 0; i < groups.size(); i++)
            {
                //The solver here uses a randomized algorithm,
                //the randomness serves no real security purpose but is just
                //needed to prevent degenerate behavior and it is important
                //that the rng is fast. We do not use a constant random sequence,
                //because there may be some privacy improvement by making
                //the selection random.
                if (nPass == 0 ? insecure_rand.randbool() : !vfIncluded[i])
                {
                    nTotal += groups[i].GetSelectionAmount();
                    selected_coins_weight += groups[i].m_weight;
                    vfIncluded[i] = true;
                    if (nTotal >= nTargetValue && selected_coins_weight <= max_selection_weight) {
                        fReachedTarget = true;
                        // If the total is between nTargetValue and nBest, it's our new best
                        // approximation.
                        if (nTotal < nBest)
                        {
                            nBest = nTotal;
                            vfBest = vfIncluded;
                        }
                        nTotal -= groups[i].GetSelectionAmount();
                        selected_coins_weight -= groups[i].m_weight;
                        vfIncluded[i] = false;
                    }
                }
            }
        }
    }
}